

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall MacProj::test_umac_periodic(MacProj *this,int level,MultiFab *u_mac)

{
  Geometry *this_00;
  ostream *os;
  int *piVar1;
  int iVar2;
  pointer pGVar3;
  uint uVar4;
  Real RVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer ppVar8;
  undefined8 uVar9;
  FabArrayId fabarrayid;
  ulong uVar10;
  BaseFab<double> *src;
  ostream *os_;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  FabArray<amrex::FArrayBox> *fabarray;
  BoxArray *this_01;
  Box *destFabBox;
  vector<TURec,_std::allocator<TURec>_> pirm;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  MultiFabId mfid [3];
  Box eDomain;
  Box r_1;
  int nrecv;
  int local_2d8;
  int local_2d0;
  Vector<int,_std::allocator<int>_> *local_2c0;
  FillBoxId local_294;
  MultiFabCopyDescriptor mfcd;
  Box eBox;
  FArrayBox diff;
  TURec r;
  
  pGVar3 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = pGVar3 + level;
  if (((*(char *)((long)(pGVar3 + level) + 0x51) != '\0') ||
      ((this_00->super_CoordSys).field_0x52 != '\0')) ||
     ((this_00->super_CoordSys).field_0x53 == '\x01')) {
    amrex::FArrayBox::FArrayBox(&diff);
    amrex::MultiFabCopyDescriptor::MultiFabCopyDescriptor(&mfcd);
    mfid[2].fabArrayId = -1;
    mfid[0].fabArrayId = -1;
    mfid[1].fabArrayId = -1;
    pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              (&pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,0x1b,
               (allocator_type *)&r);
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      if (*(char *)((long)(this_00->super_CoordSys).inv_dx + lVar12 + 0x19) == '\x01') {
        uVar6 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
        uVar7 = *(undefined8 *)((this_00->domain).bigend.vect + 2);
        eDomain.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
        eDomain.bigend.vect[2] = (int)uVar7;
        eDomain.btype.itype = SUB84(uVar7,4);
        uVar9 = eDomain._20_8_;
        eDomain.smallend.vect._0_8_ = *(undefined8 *)(this_00->domain).smallend.vect;
        eDomain.smallend.vect[2] = (int)uVar6;
        eDomain.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
        eDomain.btype.itype = SUB84(uVar7,4);
        uVar4 = eDomain.btype.itype >> ((uint)lVar12 & 0x1f);
        eDomain._20_8_ = uVar9;
        if ((uVar4 & 1) == 0) {
          piVar1 = eDomain.bigend.vect + lVar12;
          *piVar1 = *piVar1 + 1;
          eDomain.btype.itype = eDomain.btype.itype | 1 << ((byte)lVar12 & 0x1f);
        }
        fabarray = &u_mac[lVar12].super_FabArray<amrex::FArrayBox>;
        fabarrayid = amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::RegisterFabArray
                               (&mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>,fabarray);
        mfid[lVar12].fabArrayId = fabarrayid.fabArrayId;
        amrex::MFIter::MFIter((MFIter *)&nrecv,&fabarray->super_FabArrayBase,'\0');
        this_01 = &(fabarray->super_FabArrayBase).boxarray;
        while( true ) {
          if (local_2d0 <= local_2d8) break;
          amrex::BoxArray::operator[]
                    (&eBox,this_01,
                     (local_2c0->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[local_2d8]);
          amrex::Geometry::periodicShift(this_00,&eDomain,&eBox,&pshifts);
          uVar10 = ((long)pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_start) / 0xc;
          uVar11 = uVar10 & 0xffffffff;
          if ((int)uVar10 < 1) {
            uVar11 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
            amrex::Box::operator+=
                      (&eBox,pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar10);
            amrex::BoxArray::intersections(this_01,&eBox,&isects);
            uVar13 = (ulong)((long)isects.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)isects.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5;
            uVar14 = uVar13 & 0xffffffff;
            if ((int)uVar13 < 1) {
              uVar14 = 0;
            }
            for (lVar15 = 0;
                ppVar8 = isects.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, uVar14 * 0x20 != lVar15;
                lVar15 = lVar15 + 0x20) {
              destFabBox = (Box *)((long)((isects.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend.vect + lVar15);
              r_1.smallend.vect._0_8_ = *(undefined8 *)(destFabBox->smallend).vect;
              uVar6 = *(undefined8 *)
                       ((long)((isects.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second).bigend.vect +
                       lVar15);
              r_1._20_8_ = *(undefined8 *)
                            ((long)((isects.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->second).bigend.vect
                            + lVar15 + 8);
              r_1.smallend.vect[2] =
                   (int)*(undefined8 *)
                         ((long)((isects.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect
                         + lVar15 + 8);
              r_1.bigend.vect[0] = (int)uVar6;
              r_1.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
              amrex::Box::operator-=
                        (&r_1,pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar10);
              r.m_idx = (local_2c0->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_2d8];
              r.m_fbid.m_fillBox.smallend.vect[0] = 1;
              r.m_fbid.m_fillBox.smallend.vect[1] = 1;
              r.m_fbid.m_fillBox.bigend.vect[0] = 0;
              r.m_fbid.m_fillBox.bigend.vect[1] = 0;
              r.m_fbid.m_fillBox.bigend.vect[2] = 0;
              r.m_fbid.m_fillBox.btype.itype = 0;
              r.m_fbid.m_fillBoxId = -1;
              r.m_fbid.m_fabIndex = -1;
              r.m_srcBox.smallend.vect._0_8_ = *(undefined8 *)(destFabBox->smallend).vect;
              uVar6 = *(undefined8 *)((long)(ppVar8->second).smallend.vect + lVar15 + 8);
              r.m_srcBox._20_8_ = *(undefined8 *)((long)(ppVar8->second).bigend.vect + lVar15 + 8);
              r.m_srcBox.bigend.vect[1] =
                   (int)((ulong)*(undefined8 *)((long)(ppVar8->second).bigend.vect + lVar15) >> 0x20
                        );
              r.m_srcBox.smallend.vect[2] = (int)uVar6;
              r.m_srcBox.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
              r.m_dstBox.bigend.vect[1] = r_1.bigend.vect[1];
              r.m_dstBox.bigend.vect[2] = r_1.bigend.vect[2];
              r.m_dstBox.btype.itype = r_1.btype.itype;
              r.m_dstBox.smallend.vect[0] = r_1.smallend.vect[0];
              r.m_dstBox.smallend.vect[1] = r_1.smallend.vect[1];
              r.m_dstBox.smallend.vect[2] = r_1.smallend.vect[2];
              r.m_dstBox.bigend.vect[0] = r_1.bigend.vect[0];
              r.m_fbid.m_fillBox.smallend.vect[2] = 1;
              r.m_dim = (uint)lVar12;
              amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                        (&local_294,&mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>,fabarrayid,
                         destFabBox,(BoxList *)0x0,
                         *(int *)((long)((isects.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second).
                                        smallend.vect + lVar15 + -4),0,0,1,true);
              r.m_fbid.m_fabIndex = local_294.m_fabIndex;
              r.m_fbid.m_fillBox.bigend.vect[1] = local_294.m_fillBox.bigend.vect[1];
              r.m_fbid.m_fillBox.bigend.vect[2] = local_294.m_fillBox.bigend.vect[2];
              r.m_fbid.m_fillBox.btype.itype = local_294.m_fillBox.btype.itype;
              r.m_fbid.m_fillBoxId = local_294.m_fillBoxId;
              r.m_fbid.m_fillBox.smallend.vect[0] = local_294.m_fillBox.smallend.vect[0];
              r.m_fbid.m_fillBox.smallend.vect[1] = local_294.m_fillBox.smallend.vect[1];
              r.m_fbid.m_fillBox.smallend.vect[2] = local_294.m_fillBox.smallend.vect[2];
              r.m_fbid.m_fillBox.bigend.vect[0] = local_294.m_fillBox.bigend.vect[0];
              std::vector<TURec,_std::allocator<TURec>_>::push_back(&pirm,&r);
            }
            amrex::Box::operator-=
                      (&eBox,pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar10);
          }
          amrex::MFIter::operator++((MFIter *)&nrecv);
        }
        amrex::MFIter::~MFIter((MFIter *)&nrecv);
      }
    }
    nrecv = (int)(((long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                        super__Vector_impl_data._M_start) / 100);
    amrex::ParallelDescriptor::ReduceIntMax(&nrecv);
    if (nrecv != 0) {
      mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>.dataAvailable = true;
      lVar12 = 0x40;
      os = (ostream *)(r.m_fbid.m_fillBox.bigend.vect + 1);
      uVar10 = 0;
      while( true ) {
        if ((ulong)(((long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                          super__Vector_impl_data._M_start) / 100) <= uVar10) break;
        iVar2 = *(int *)((long)(&((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                   super__Vector_impl_data._M_start)->m_fbid).m_fillBox + 1) +
                        lVar12 + 4);
        amrex::FArrayBox::resize
                  ((FArrayBox *)&diff.super_BaseFab<double>,
                   (Box *)((long)(&((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                     super__Vector_impl_data._M_start)->m_fbid).m_fillBox + -1) +
                          lVar12),1,(Arena *)0x0);
        amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                  (&mfcd.super_FabArrayCopyDescriptor<amrex::FArrayBox>,
                   (FabArrayId)mfid[iVar2].fabArrayId,
                   (FillBoxId *)
                   ((long)((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                            super__Vector_impl_data._M_start)->m_fbid).m_fillBox.smallend.vect +
                   lVar12 + -0x40),(FArrayBox *)&diff.super_BaseFab<double>);
        src = &amrex::FabArray<amrex::FArrayBox>::fabPtr
                         (&u_mac[iVar2].super_FabArray<amrex::FArrayBox>,
                          *(int *)((long)(&((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->m_fbid).
                                           m_fillBox + 1) + lVar12))->super_BaseFab<double>;
        amrex::BaseFab<double>::minus<(amrex::RunOn)1>
                  (&diff.super_BaseFab<double>,src,
                   (Box *)((long)((pirm.super__Vector_base<TURec,_std::allocator<TURec>_>._M_impl.
                                   super__Vector_impl_data._M_start)->m_fbid).m_fillBox.smallend.
                                 vect + lVar12),&diff.super_BaseFab<double>.domain,0,0,1);
        RVar5 = amrex::BaseFab<double>::norm<(amrex::RunOn)1>(&diff.super_BaseFab<double>,0,0,1);
        if ((anonymous_namespace)::umac_periodic_test_Tol < RVar5) {
          os_ = amrex::OutStream();
          amrex::Print::Print((Print *)&r,os_);
          std::operator<<(os,"dir = ");
          std::ostream::operator<<(os,iVar2);
          std::operator<<(os,", diff norm = ");
          std::ostream::_M_insert<double>(RVar5);
          std::operator<<(os," for region: ");
          amrex::operator<<(os,(Box *)((long)((pirm.
                                               super__Vector_base<TURec,_std::allocator<TURec>_>.
                                               _M_impl.super__Vector_impl_data._M_start)->m_fbid).
                                             m_fillBox.smallend.vect + lVar12));
          std::endl<char,std::char_traits<char>>(os);
          amrex::Print::~Print((Print *)&r);
          amrex::Error_host("Periodic bust in u_mac");
        }
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 100;
      }
    }
    std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
    ~_Vector_base(&isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 );
    std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
              ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&pshifts);
    std::_Vector_base<TURec,_std::allocator<TURec>_>::~_Vector_base
              (&pirm.super__Vector_base<TURec,_std::allocator<TURec>_>);
    amrex::MultiFabCopyDescriptor::~MultiFabCopyDescriptor(&mfcd);
    amrex::BaseFab<double>::~BaseFab(&diff.super_BaseFab<double>);
  }
  return;
}

Assistant:

void
MacProj::test_umac_periodic (int       level,
                             MultiFab* u_mac)
{
    const Geometry& geom = parent->Geom(level);

    if (!geom.isAnyPeriodic()) return;

    FArrayBox              diff;
    MultiFabCopyDescriptor mfcd;
    MultiFabId             mfid[BL_SPACEDIM];
    std::vector<TURec>     pirm;
    Vector<IntVect>         pshifts(27);
    std::vector< std::pair<int,Box> > isects;


    for (int dim = 0; dim < BL_SPACEDIM; dim++)
    {
        if (geom.isPeriodic(dim))
        {
            Box eDomain = amrex::surroundingNodes(geom.Domain(),dim);

            mfid[dim] = mfcd.RegisterMultiFab(&u_mac[dim]);

            // How to combine pirm into one global pirm?
            // don't think std::vector::push_back() is thread safe
            // #ifdef _OPENMP
            // #pragma omp parallel
            // #endif
            // {
            //             std::vector<TURec>     pirm;
            //             std::vector< std::pair<int,Box> > isects;
            //             Vector<IntVect>         pshifts(27);

            for (MFIter mfi(u_mac[dim]); mfi.isValid(); ++mfi)
            {
                Box eBox = u_mac[dim].boxArray()[mfi.index()];

                geom.periodicShift(eDomain, eBox, pshifts);

                for (int iiv = 0, M = pshifts.size(); iiv < M; iiv++)
                {
                    eBox += pshifts[iiv];

                    u_mac[dim].boxArray().intersections(eBox,isects);

                    for (int i = 0, N = isects.size(); i < N; i++)
                    {
                        const Box& srcBox = isects[i].second;
                        const Box& dstBox = srcBox - pshifts[iiv];

                        TURec r(mfi.index(),dim,srcBox,dstBox);

                        r.m_fbid = mfcd.AddBox(mfid[dim],
                                               srcBox,
                                               0,
                                               isects[i].first,
                                               0,
                                               0,
                                               1);
                        pirm.push_back(r);
                    }

                    eBox -= pshifts[iiv];
                }
            }
            // }// end OMP region
        }
    }

    int nrecv = pirm.size();
    ParallelDescriptor::ReduceIntMax(nrecv);
    if (nrecv == 0)
        //
        // There's no parallel work to do.
        //
        return;

    mfcd.CollectData();

    for (long unsigned int i = 0; i < pirm.size(); i++)
    {
        const int dim = pirm[i].m_dim;

        BL_ASSERT(pirm[i].m_fbid.box() == pirm[i].m_srcBox);
        BL_ASSERT(pirm[i].m_srcBox.sameSize(pirm[i].m_dstBox));
        BL_ASSERT(u_mac[dim].DistributionMap()[pirm[i].m_idx] == ParallelDescriptor::MyProc());

        diff.resize(pirm[i].m_srcBox, 1);

        mfcd.FillFab(mfid[dim], pirm[i].m_fbid, diff);

        diff.minus<RunOn::Host>(u_mac[dim][pirm[i].m_idx],pirm[i].m_dstBox,diff.box(),0,0,1);

        const Real max_norm = diff.norm<RunOn::Host>(0);

        if (max_norm > umac_periodic_test_Tol )
        {
            amrex::Print() << "dir = "         << dim
                           << ", diff norm = " << max_norm
                           << " for region: "  << pirm[i].m_dstBox << std::endl;
            amrex::Error("Periodic bust in u_mac");
        }
    }
}